

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

bool Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsAllocationPageAligned
               (char *address,size_t pageCount,uint *nextIndex)

{
  uintptr_t mask;
  uint *nextIndex_local;
  size_t pageCount_local;
  char *address_local;
  
  if (((ulong)address & pageCount * 0x1000 - 1) == 0) {
    address_local._7_1_ = true;
  }
  else {
    if (nextIndex != (uint *)0x0) {
      *nextIndex = (uint)((ulong)address % (pageCount * 0x1000) >> 0xc);
    }
    address_local._7_1_ = false;
  }
  return address_local._7_1_;
}

Assistant:

bool
PageSegmentBase<T>::IsAllocationPageAligned(__in char* address, size_t pageCount, uint *nextIndex)
{
    // Require that allocations are aligned at a boundary
    // corresponding to the page count
    // REVIEW: This might actually lead to additional address space fragmentation
    // because of the leading guard pages feature in the page allocator
    // We can restrict the guard pages to be an even number to improve the chances
    // of having the first allocation be aligned but that reduces the effectiveness
    // of having a random number of guard pages
    uintptr_t mask = (pageCount * AutoSystemInfo::PageSize) - 1;
    if ((reinterpret_cast<uintptr_t>(address)& mask) == 0)
    {
        return true;
    }

    if (nextIndex != nullptr)
    {
        *nextIndex = (uint) ((reinterpret_cast<uintptr_t>(address) % (mask + 1)) / AutoSystemInfo::PageSize);
    }

    return false;
}